

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

int nettlp_run_cb(nettlp **nt,int nnts,nettlp_cb *cb,void *arg)

{
  _func_int_nettlp_ptr_tlp_mr_hdr_ptr_void_ptr_size_t_void_ptr *p_Var1;
  nettlp *pnVar2;
  _func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr_size_t_void_ptr *p_Var3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  _func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *p_Var10;
  void *pvVar11;
  ulong uVar12;
  pollfd x [16];
  char buf [4096];
  
  if (nnts < 0x11) {
    uVar8 = 0;
    uVar12 = 0;
    if (0 < nnts) {
      uVar12 = (ulong)(uint)nnts;
    }
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      x[uVar8].fd = nt[uVar8]->sockfd;
      x[uVar8].events = 1;
    }
    uVar8 = 0;
    while (iVar6 = (int)uVar8, stop_flag == '\0') {
      uVar5 = poll((pollfd *)x,(long)nnts,500);
      uVar9 = (ulong)uVar5;
      if ((int)uVar5 < 0) {
        return uVar5;
      }
      uVar8 = 0;
      if (uVar5 != 0) {
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          if ((x[uVar8].revents & 1) != 0) {
            uVar9 = read(nt[uVar8]->sockfd,buf,0x1000);
            if ((int)uVar9 < 0) break;
            bVar4 = buf[6] & 0x5f;
            if (bVar4 == 0x4a) {
              p_Var3 = cb->cpld;
              if (p_Var3 == (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr_size_t_void_ptr *)0x0)
              goto LAB_00103806;
              pnVar2 = nt[uVar8];
              bVar4 = buf[6] & 0x20;
              uVar5 = (uint)(byte)buf[0x11];
              iVar6 = tlp_cpld_data_length((tlp_cpl_hdr *)(buf + 6));
              (*p_Var3)(pnVar2,(tlp_cpl_hdr *)(buf + 6),
                        buf + (ulong)(uVar5 & 3) + (ulong)(bVar4 >> 5) * 4 + 0x16,(long)iVar6,arg);
            }
            else {
              if (bVar4 == 10) {
                p_Var10 = cb->cpl;
LAB_0010373d:
                if (p_Var10 == (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)0x0)
                goto LAB_00103806;
              }
              else {
                if (bVar4 == 0x40) {
                  p_Var1 = cb->mwr;
                  if (p_Var1 != (_func_int_nettlp_ptr_tlp_mr_hdr_ptr_void_ptr_size_t_void_ptr *)0x0)
                  {
                    pnVar2 = nt[uVar8];
                    pvVar11 = tlp_mwr_data((tlp_mr_hdr *)(buf + 6));
                    iVar6 = tlp_mr_data_length((tlp_mr_hdr *)(buf + 6));
                    (*p_Var1)(pnVar2,(tlp_mr_hdr *)(buf + 6),pvVar11,(long)iVar6,arg);
                    goto LAB_00103826;
                  }
                }
                else if ((buf[6] & 0x5fU) == 0) {
                  p_Var10 = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)cb->mrd;
                  goto LAB_0010373d;
                }
LAB_00103806:
                p_Var10 = (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)cb->other;
                if (p_Var10 == (_func_int_nettlp_ptr_tlp_cpl_hdr_ptr_void_ptr *)0x0)
                goto LAB_00103826;
              }
              (*p_Var10)(nt[uVar8],(tlp_cpl_hdr *)(buf + 6),arg);
            }
          }
LAB_00103826:
        }
        uVar8 = uVar9 & 0xffffffff;
      }
    }
  }
  else {
    piVar7 = __errno_location();
    *piVar7 = -0x16;
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int nettlp_run_cb(struct nettlp **nt, int nnts,
		  struct nettlp_cb *cb, void *arg)
{
	int ret = 0, n;
	ssize_t received;
	struct pollfd x[NETTLP_CB_MAX_NTS];
	char buf[4096];
	struct nettlp_hdr *nh;
	struct tlp_hdr *th;
	struct tlp_mr_hdr *mh;
	struct tlp_cpl_hdr *ch;

	if (nnts > NETTLP_CB_MAX_NTS) {
		errno = -EINVAL;
		return -1;
	}

	for (n = 0; n < nnts; n++) {
		x[n].fd = nt[n]->sockfd;
		x[n].events = POLLIN;
	}

	while (1) {

		if (stop_flag)
			break;

		ret = poll(x, nnts, LIBTLP_CPL_TIMEOUT);
		if (ret < 0)
			break;

		if (ret == 0)
			continue;	/* timeout */

		for (n = 0; n < nnts; n++) {

			if (!(x[n].revents & POLLIN))
				continue;

			ret = read(nt[n]->sockfd, buf, sizeof(buf));
			if (ret < 0)
				break;

			nh = (struct nettlp_hdr *)buf;
			th = (struct tlp_hdr *)(nh + 1);
			mh = (struct tlp_mr_hdr *)th;
			ch = (struct tlp_cpl_hdr *)th;

			if (tlp_is_mrd(th->fmt_type) && cb->mrd) {
				cb->mrd(nt[n], mh, arg);
			} else if (tlp_is_mwr(th->fmt_type) && cb->mwr) {

				cb->mwr(nt[n], mh, tlp_mwr_data(mh),
					tlp_mr_data_length(mh), arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_wo_data(th->fmt_type) && cb->cpl) {

				cb->cpl(nt[n], ch, arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_w_data(th->fmt_type) && cb->cpld) {

				cb->cpld(nt[n], ch, tlp_cpld_data(ch),
					 tlp_cpld_data_length(ch), arg);
			} else if (cb->other) {
				cb->other(nt[n], th, arg);
			}
		}
	}

	return ret;
}